

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4-packet.cc
# Opt level: O0

void __thiscall Ipv4Packet::Print(Ipv4Packet *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<(in_RSI,"Ipv4 Packet:");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"source ip: ");
  num2ip_abi_cxx11_(os._4_4_);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"destination ip: ");
  num2ip_abi_cxx11_(os._4_4_);
  poVar1 = std::operator<<(poVar1,local_60);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(local_60);
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"total length: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)(in_RDI + 0x2a));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"identification: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)(in_RDI + 0x24));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"flags: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)(in_RDI + 0x26));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"fragment offset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)(in_RDI + 0x28));
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_10,'\t');
  poVar1 = std::operator<<(poVar1,"protocol: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*(byte *)(in_RDI + 0x2c));
  std::operator<<(poVar1,'\n');
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Ipv4Packet::Print(std::ostream& os)
{
    os << "Ipv4 Packet:" << '\n';
    os << '\t' << "source ip: " << num2ip(sip) << '\n';
    os << '\t' << "destination ip: " << num2ip(dip) << '\n';
    os << '\t' << "total length: " << tlen << '\n';
    os << '\t' << "identification: " << id << '\n';
    os << '\t' << "flags: " << flags << '\n';
    os << '\t' << "fragment offset: " << offset << '\n';
    os << '\t' << "protocol: " << (uint32_t)protocol << '\n';
    os << std::endl;
}